

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O2

int brynet::net::HTTPParser::sMessageBegin(http_parser *hp)

{
  void *pvVar1;
  
  pvVar1 = hp->data;
  *(undefined1 *)((long)pvVar1 + 0x7b) = 1;
  *(undefined8 *)((long)pvVar1 + 0x88) = 0;
  **(undefined1 **)((long)pvVar1 + 0x80) = 0;
  *(undefined8 *)((long)pvVar1 + 0xa8) = 0;
  **(undefined1 **)((long)pvVar1 + 0xa0) = 0;
  return 0;
}

Assistant:

int HTTPParser::sMessageBegin(http_parser* hp)
{
    HTTPParser* httpParser = (HTTPParser*)hp->data;
    httpParser->mLastWasValue = true;
    httpParser->mCurrentField.clear();
    httpParser->mCurrentValue.clear();

    return 0;
}